

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O2

void cfd::TransactionContextUtil::Verify<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,UtxoData *utxo,
               AbstractTxIn *txin,
               function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *create_sighash_func)

{
  ByteData BVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  CfdException *pCVar5;
  uint uVar6;
  long lVar7;
  SchnorrPubkey *this;
  unsigned_long __val;
  ulong uVar8;
  undefined8 in_stack_fffffffffffff8f8;
  undefined8 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  bool has_parity;
  uint8_t leaf_version;
  bool has_pubkey;
  WitnessVersion version;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  SchnorrSignature schnorr_sig;
  int local_66c;
  SchnorrPubkey witness_program;
  pointer local_660;
  Script script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> signature_stack;
  SchnorrPubkey internal_pubkey;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  uint32_t req_num;
  ByteData256 sighash;
  SigHashType sighashtype_1;
  ByteData annex;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_538;
  UtxoData work_utxo;
  ulong __n;
  
  bVar2 = IsOpTrueLockingScript(utxo,txin);
  if (bVar2) {
    return;
  }
  UtxoData::UtxoData(&work_utxo,utxo);
  if (work_utxo.address_type == kP2shAddress) {
    items.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::AbstractTxIn::GetUnlockingScript();
    cfd::core::Script::GetElementList();
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::_M_move_assign
              (&items,&schnorr_sig);
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &schnorr_sig);
    core::Script::~Script(&script);
    if ((long)items.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)items.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      cfd::core::ScriptElement::GetBinaryData();
      cfd::core::Script::Script(&script,(ByteData *)&schnorr_sig);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
      cVar3 = cfd::core::Script::IsP2wpkhScript();
      if (cVar3 == '\0') {
        cVar3 = cfd::core::Script::IsP2wshScript();
        if (cVar3 != '\0') {
          work_utxo.address_type = kP2shP2wshAddress;
        }
      }
      else {
        work_utxo.address_type = kP2shP2wpkhAddress;
      }
      core::Script::~Script(&script);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&items);
  }
  has_pubkey = false;
  version = kVersionNone;
  GetVerifySignatureStack(&signature_stack,&work_utxo,txin,&version,&has_pubkey);
  if (version == kVersion1) {
    cfd::core::Script::GetElementList();
    cfd::core::ScriptElement::GetBinaryData();
    cfd::core::SchnorrPubkey::SchnorrPubkey(&witness_program,(ByteData *)&script);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&items);
    cfd::core::SchnorrSignature::SchnorrSignature(&schnorr_sig);
    has_parity = false;
    leaf_version = '\0';
    cfd::core::SchnorrPubkey::SchnorrPubkey(&internal_pubkey);
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Script::Script(&script);
    cfd::core::ByteData::ByteData(&annex);
    cfd::core::TaprootUtil::ParseTaprootSignData
              ((vector *)&signature_stack,&schnorr_sig,&has_parity,&leaf_version,&internal_pubkey,
               (vector *)&nodes,&script,(vector *)0x0,&annex);
    if (has_pubkey != true) {
      cfd::core::TaprootUtil::VerifyTaprootCommitment
                (has_parity,leaf_version,&witness_program,&internal_pubkey,(vector *)&nodes,&script,
                 (ByteData256 *)0x0);
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&items,"The script analysis of tapscript is not supported.",
                 (allocator *)&sighash);
      core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&items);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::SchnorrSignature::GetSigHashType();
    cfd::core::Pubkey::Pubkey((Pubkey *)&sighashtype_1);
    cfd::core::Script::Script((Script *)&items);
    std::
    function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
    ::operator()(&sighash,create_sighash_func,transaction,outpoint,&work_utxo,
                 (SigHashType *)&req_num,(Pubkey *)&sighashtype_1,(Script *)&items,version,&annex,
                 (TaprootScriptTree *)0x0);
    core::Script::~Script((Script *)&items);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighashtype_1);
    cVar3 = cfd::core::SchnorrPubkey::Verify
                      ((SchnorrSignature *)&witness_program,(ByteData256 *)&schnorr_sig);
    if (cVar3 == '\0') {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&items,"Verify signature fail.",(allocator *)&sighashtype_1);
      core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&items);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&annex);
    core::Script::~Script(&script);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&internal_pubkey);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
    this = &witness_program;
  }
  else {
    if (has_pubkey != true) {
      cfd::core::Script::Script
                (&script,signature_stack.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1);
      cVar3 = cfd::core::Script::IsMultisigScript();
      if (cVar3 == '\0') {
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&items,"Unsupported script format. verify support is multisig only.",
                   (allocator *)&schnorr_sig);
        core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&items);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      if (work_utxo.address_type == kP2shAddress) {
        cfd::core::ByteData::GetHex_abi_cxx11_();
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&items,"00");
        std::__cxx11::string::~string((string *)&items);
        if (bVar2) {
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&items,"Invalid multisig format. top stack is OP_0 only.",
                     (allocator *)&schnorr_sig);
          core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&items);
          __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      else {
        cVar3 = cfd::core::ByteData::IsEmpty();
        if (cVar3 == '\0') {
          pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&items,"Invalid multisig format. top byte is empty only.",
                     (allocator *)&schnorr_sig);
          core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&items);
          __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      req_num = 0;
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
                ((Script *)&witness_program,(uint *)&script);
      uVar6 = (int)(((long)signature_stack.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)signature_stack.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) - 2;
      __n = (ulong)uVar6;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &internal_pubkey,__n,(allocator_type *)&items);
      std::vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_>::vector
                ((vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_> *)&nodes,
                 __n,(allocator_type *)&items);
      if (uVar6 < req_num) {
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&items,"Signature count is less than multisig require count.",
                   (allocator *)&schnorr_sig);
        core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&items);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      items.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&items.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      items.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      items.super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)items.
                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      cfd::core::SigHashType::SigHashType(&sighashtype_1);
      local_66c = -1;
      uVar4 = 0;
      __val = 0;
      while (__val != __n) {
        cfd::core::CryptoUtil::ConvertSignatureFromDer
                  (&annex,(SigHashType *)
                          (signature_stack.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start + __val + 1));
        cfd::core::Pubkey::Pubkey((Pubkey *)&schnorr_sig);
        std::
        function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
        ::operator()(&sighash,create_sighash_func,transaction,outpoint,&work_utxo,&sighashtype_1,
                     (Pubkey *)&schnorr_sig,&script,version,(ByteData *)0x0,(TaprootScriptTree *)0x0
                    );
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
        lVar7 = 0;
        for (uVar8 = 0; uVar8 < (ulong)(((long)local_660 - (long)_witness_program) / 0x18);
            uVar8 = uVar8 + 1) {
          cVar3 = cfd::core::SignatureUtil::VerifyEcSignature
                            (&sighash,(Pubkey *)((long)_witness_program + lVar7),&annex);
          if (cVar3 != '\0') {
            if ((int)uVar8 <= local_66c) {
              pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string
                        ((string *)&schnorr_sig,"Signature order is incorrect.",
                         (allocator *)&has_parity);
              core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&schnorr_sig);
              __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            uVar4 = uVar4 + 1;
            local_66c = (int)uVar8;
            goto LAB_0020a0e2;
          }
          lVar7 = lVar7 + 0x18;
        }
        if (items.
            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
            _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          std::__cxx11::string::append((char *)&items);
        }
        std::__cxx11::to_string((string *)&schnorr_sig,__val);
        std::__cxx11::string::append((string *)&items);
        std::__cxx11::string::~string((string *)&schnorr_sig);
LAB_0020a0e2:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&annex);
        __val = __val + 1;
      }
      if (uVar4 != uVar6) {
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &schnorr_sig,"Verify signature fail. fail index = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&items);
        core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&schnorr_sig);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::__cxx11::string::~string((string *)&items);
      std::_Vector_base<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_>::
      ~_Vector_base((_Vector_base<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_> *
                    )&nodes);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &internal_pubkey);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)&witness_program);
      core::Script::~Script(&script);
      goto LAB_0020a14a;
    }
    cfd::core::SigHashType::SigHashType((SigHashType *)&internal_pubkey);
    cfd::core::CryptoUtil::ConvertSignatureFromDer
              ((ByteData *)&items,
               (SigHashType *)
               signature_stack.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_538,
               &signature_stack.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start[1].data_);
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff900;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8f8;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff908;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff90c;
    cfd::core::Pubkey::Pubkey((Pubkey *)&schnorr_sig,BVar1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_538);
    cfd::core::Script::Script(&script);
    std::
    function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
    ::operator()((ByteData256 *)&witness_program,create_sighash_func,transaction,outpoint,&work_utxo
                 ,(SigHashType *)&internal_pubkey,(Pubkey *)&schnorr_sig,&script,version,
                 (ByteData *)0x0,(TaprootScriptTree *)0x0);
    core::Script::~Script(&script);
    cVar3 = cfd::core::SignatureUtil::VerifyEcSignature
                      ((ByteData256 *)&witness_program,(Pubkey *)&schnorr_sig,(ByteData *)&items);
    if (cVar3 == '\0') {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&script,"Verify signature fail.",(allocator *)&nodes);
      core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&script);
      __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_program);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_sig);
    this = (SchnorrPubkey *)&items;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
LAB_0020a14a:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&signature_stack);
  UtxoData::~UtxoData(&work_utxo);
  return;
}

Assistant:

void TransactionContextUtil::Verify(
    const Tx* transaction, const OutPoint& outpoint, const UtxoData& utxo,
    const AbstractTxIn* txin,
    std::function<ByteData256(
        const Tx*, const OutPoint&, const UtxoData&, const SigHashType&,
        const Pubkey&, const Script&, WitnessVersion, const ByteData*,
        const TaprootScriptTree*)>
        create_sighash_func) {
  if (TransactionContextUtil::IsOpTrueLockingScript(utxo, txin)) {
    return;  // OP_TRUE only.
  }

  // Correspondence when addressType is extracted from address string.
  UtxoData work_utxo = utxo;
  if (work_utxo.address_type == AddressType::kP2shAddress) {
    std::vector<ScriptElement> items;
    items = txin->GetUnlockingScript().GetElementList();
    if (items.size() == 1) {
      Script script = Script(items[0].GetBinaryData());
      if (script.IsP2wpkhScript()) {
        work_utxo.address_type = AddressType::kP2shP2wpkhAddress;
      } else if (script.IsP2wshScript()) {
        work_utxo.address_type = AddressType::kP2shP2wshAddress;
      }
    }
  }

  bool has_pubkey = false;
  WitnessVersion version = WitnessVersion::kVersionNone;
  std::vector<ByteData> signature_stack =
      TransactionContextUtil::GetVerifySignatureStack(
          work_utxo, txin, &version, &has_pubkey);

  if (version == WitnessVersion::kVersion1) {
    SchnorrPubkey witness_program(
        utxo.locking_script.GetElementList()[1].GetBinaryData());
    SchnorrSignature schnorr_sig;
    bool has_parity = false;
    uint8_t leaf_version = 0;
    SchnorrPubkey internal_pubkey;
    std::vector<ByteData256> nodes;
    Script tapscript;
    ByteData annex;
    TaprootUtil::ParseTaprootSignData(
        signature_stack, &schnorr_sig, &has_parity, &leaf_version,
        &internal_pubkey, &nodes, &tapscript, nullptr, &annex);
    if (has_pubkey) {
      auto sighash = create_sighash_func(
          transaction, outpoint, work_utxo, schnorr_sig.GetSigHashType(),
          Pubkey(), Script(), version, &annex, nullptr);
      bool is_verify = witness_program.Verify(schnorr_sig, sighash);
      if (!is_verify) {
        throw CfdException(
            CfdError::kCfdIllegalStateError, "Verify signature fail.");
      }
    } else {
      TaprootUtil::VerifyTaprootCommitment(
          has_parity, leaf_version, witness_program, internal_pubkey, nodes,
          tapscript);
      // At the moment, there is no function to run Script,
      // so no further confirmation is possible.
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "The script analysis of tapscript is not supported.");
    }
  } else if (has_pubkey) {
    SigHashType sighashtype;
    ByteData signature =
        CryptoUtil::ConvertSignatureFromDer(signature_stack[0], &sighashtype);
    Pubkey pubkey(signature_stack[1]);
    auto sighash = create_sighash_func(
        transaction, outpoint, work_utxo, sighashtype, pubkey, Script(),
        version, nullptr, nullptr);
    bool is_verify =
        SignatureUtil::VerifyEcSignature(sighash, pubkey, signature);
    if (!is_verify) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Verify signature fail.");
    }
  } else {
    // check script format
    Script redeem_script(signature_stack.back());
    if (!redeem_script.IsMultisigScript()) {
      // At the moment, there is no function to run Script,
      // so no further confirmation is possible.
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Unsupported script format. verify support is multisig only.");
    }
    if (work_utxo.address_type == AddressType::kP2shAddress) {
      if (signature_stack[0].GetHex() != "00") {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Invalid multisig format. top stack is OP_0 only.");
      }
    } else {
      if (!signature_stack[0].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Invalid multisig format. top byte is empty only.");
      }
    }
    uint32_t req_num = 0;
    std::vector<Pubkey> pubkeys =
        ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script, &req_num);

    uint32_t sig_size = static_cast<uint32_t>(signature_stack.size()) - 2;
    std::vector<ByteData> signatures(sig_size);
    std::vector<SigHashType> sighashtype_list(sig_size);
    if (sig_size < req_num) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Signature count is less than multisig require count.");
    }

    uint32_t success_count = 0;
    std::string fail_indexes;
    SigHashType sighashtype;
    int prev_key_index = -1;
    for (size_t index = 0; index < sig_size; ++index) {
      bool is_exist = false;
      auto signature = CryptoUtil::ConvertSignatureFromDer(
          signature_stack[index + 1], &sighashtype);
      auto sighash = create_sighash_func(
          transaction, outpoint, work_utxo, sighashtype, Pubkey(),
          redeem_script, version, nullptr, nullptr);
      for (size_t key_index = 0; key_index < pubkeys.size(); ++key_index) {
        const auto& pubkey = pubkeys[key_index];
        is_exist =
            SignatureUtil::VerifyEcSignature(sighash, pubkey, signature);
        if (is_exist) {
          if (prev_key_index >= static_cast<int>(key_index)) {
            throw CfdException(
                CfdError::kCfdIllegalStateError,
                "Signature order is incorrect.");
          }
          prev_key_index = static_cast<int>(key_index);
          break;
        }
      }
      if (is_exist) {
        ++success_count;
      } else {
        if (!fail_indexes.empty()) fail_indexes += ",";
        fail_indexes += std::to_string(index);
      }
    }

    if (success_count != sig_size) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Verify signature fail. fail index = " + fail_indexes);
    }
  }
}